

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O0

void __thiscall value_string::test_method(value_string *this)

{
  undefined8 uVar1;
  byte bVar2;
  bool bVar3;
  lazy_ostream *plVar4;
  basic_cstring<const_char> local_988;
  basic_cstring<const_char> local_978;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_968;
  basic_cstring<const_char> local_948;
  assertion_result local_938;
  basic_cstring<const_char> local_920;
  basic_cstring<const_char> local_910;
  basic_cstring<const_char> local_900;
  output_test_stream local_8f0 [8];
  output_test_stream output_3;
  basic_cstring<const_char> local_770;
  basic_cstring<const_char> local_760;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_750;
  basic_cstring<const_char> local_730;
  assertion_result local_720;
  basic_cstring<const_char> local_708;
  basic_cstring<const_char> local_6f8;
  basic_cstring<const_char> local_6e8;
  output_test_stream local_6d8 [8];
  output_test_stream output_2;
  Value local_558 [16];
  Value local_548 [8];
  Value value2;
  allocator<char> local_531;
  string local_530 [8];
  string str2;
  basic_cstring<const_char> local_500;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_4f0;
  basic_cstring<const_char> local_4d0;
  assertion_result local_4c0;
  basic_cstring<const_char> local_4a8;
  basic_cstring<const_char> local_498;
  basic_cstring<const_char> local_488;
  output_test_stream local_478 [8];
  output_test_stream output_1;
  basic_cstring<const_char> local_2f8;
  basic_cstring<const_char> local_2e8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_2d8;
  basic_cstring<const_char> local_2b8;
  assertion_result local_2a8;
  basic_cstring<const_char> local_290;
  basic_cstring<const_char> local_280;
  basic_cstring<const_char> local_270;
  output_test_stream local_260 [8];
  output_test_stream output;
  basic_cstring<const_char> local_e0;
  basic_cstring<const_char> local_d0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_c0;
  assertion_result local_a0;
  basic_cstring<const_char> local_88;
  basic_cstring<const_char> local_78;
  Value local_68 [8];
  Value value;
  Value local_58 [8];
  Value value1;
  allocator<char> local_31;
  string local_30 [8];
  string str1;
  value_string *this_local;
  
  str1.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_30,"value #1",&local_31);
  std::allocator<char>::~allocator(&local_31);
  dynamicgraph::command::Value::Value(local_58,local_30);
  dynamicgraph::command::Value::Value(local_68,local_58);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_78,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_88);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_78,0x12a,&local_88);
    bVar2 = dynamicgraph::command::Value::operator==(local_58,local_68);
    boost::test_tools::assertion_result::assertion_result(&local_a0,(bool)(bVar2 & 1));
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d0,"value1 == value",0xf);
    boost::unit_test::operator<<(&local_c0,plVar4,&local_d0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e0,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
               ,0x60);
    boost::test_tools::tt_detail::report_assertion(&local_a0,&local_c0,&local_e0,0x12a,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_c0);
    boost::test_tools::assertion_result::~assertion_result(&local_a0);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_270);
  boost::test_tools::output_test_stream::output_test_stream(local_260,&local_270,1);
  dynamicgraph::command::operator<<((ostream *)local_260,local_58);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_280,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_290);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_280,0x12f,&local_290);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              (&local_2b8,"Type=string, value=value #1");
    boost::test_tools::output_test_stream::is_equal(&local_2a8,local_260,&local_2b8,1);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2e8,"output.is_equal(\"Type=string, value=value #1\")",0x2e);
    boost::unit_test::operator<<(&local_2d8,plVar4,&local_2e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2f8,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
               ,0x60);
    boost::test_tools::tt_detail::report_assertion(&local_2a8,&local_2d8,&local_2f8,0x12f,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_2d8);
    boost::test_tools::assertion_result::~assertion_result(&local_2a8);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  boost::test_tools::output_test_stream::~output_test_stream(local_260);
  boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_488);
  boost::test_tools::output_test_stream::output_test_stream(local_478,&local_488,1);
  dynamicgraph::command::operator<<((ostream *)local_478,local_68);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_498,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_4a8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_498,0x135,&local_4a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              (&local_4d0,"Type=string, value=value #1");
    boost::test_tools::output_test_stream::is_equal(&local_4c0,local_478,&local_4d0,1);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_500,"output.is_equal(\"Type=string, value=value #1\")",0x2e);
    boost::unit_test::operator<<(&local_4f0,plVar4,&local_500);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)((long)&str2.field_2 + 8),
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
               ,0x60);
    boost::test_tools::tt_detail::report_assertion
              (&local_4c0,&local_4f0,(undefined1 *)((long)&str2.field_2 + 8),0x135,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_4f0);
    boost::test_tools::assertion_result::~assertion_result(&local_4c0);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  boost::test_tools::output_test_stream::~output_test_stream(local_478);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_530,"value #2",&local_531);
  std::allocator<char>::~allocator(&local_531);
  dynamicgraph::command::Value::Value(local_548,local_530);
  dynamicgraph::command::Value::operator=(local_558,local_68);
  dynamicgraph::command::Value::~Value(local_558);
  boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_6e8);
  boost::test_tools::output_test_stream::output_test_stream(local_6d8,&local_6e8,1);
  dynamicgraph::command::operator<<((ostream *)local_6d8,local_548);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_6f8,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_708);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_6f8,0x13f,&local_708);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              (&local_730,"Type=string, value=value #2");
    boost::test_tools::output_test_stream::is_equal(&local_720,local_6d8,&local_730,1);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_760,"output.is_equal(\"Type=string, value=value #2\")",0x2e);
    boost::unit_test::operator<<(&local_750,plVar4,&local_760);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_770,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
               ,0x60);
    boost::test_tools::tt_detail::report_assertion(&local_720,&local_750,&local_770,0x13f,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_750);
    boost::test_tools::assertion_result::~assertion_result(&local_720);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  boost::test_tools::output_test_stream::~output_test_stream(local_6d8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_900);
  boost::test_tools::output_test_stream::output_test_stream(local_8f0,&local_900,1);
  dynamicgraph::command::operator<<((ostream *)local_8f0,local_68);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_910,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_920);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_910,0x145,&local_920);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              (&local_948,"Type=string, value=value #2");
    boost::test_tools::output_test_stream::is_equal(&local_938,local_8f0,&local_948,1);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_978,"output.is_equal(\"Type=string, value=value #2\")",0x2e);
    boost::unit_test::operator<<(&local_968,plVar4,&local_978);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_988,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
               ,0x60);
    boost::test_tools::tt_detail::report_assertion(&local_938,&local_968,&local_988,0x145,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_968);
    boost::test_tools::assertion_result::~assertion_result(&local_938);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  boost::test_tools::output_test_stream::~output_test_stream(local_8f0);
  dynamicgraph::command::Value::~Value(local_548);
  std::__cxx11::string::~string(local_530);
  dynamicgraph::command::Value::~Value(local_68);
  dynamicgraph::command::Value::~Value(local_58);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(value_string) {
  using dg::command::Value;

  std::string str1("value #1");
  Value value1(str1);
  Value value = value1;

  BOOST_CHECK(value1 == value);

  {
    output_test_stream output;
    output << value1;
    BOOST_CHECK(output.is_equal("Type=string, value=value #1"));
  }

  {
    output_test_stream output;
    output << value;
    BOOST_CHECK(output.is_equal("Type=string, value=value #1"));
  }

  std::string str2("value #2");
  Value value2(str2);
  value = value2;

  {
    output_test_stream output;
    output << value2;
    BOOST_CHECK(output.is_equal("Type=string, value=value #2"));
  }

  {
    output_test_stream output;
    output << value;
    BOOST_CHECK(output.is_equal("Type=string, value=value #2"));
  }
}